

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O0

void __thiscall TcpConnection::do_write(TcpConnection *this)

{
  int iVar1;
  int ret;
  TcpConnection *this_local;
  
  do {
    iVar1 = BufferBase::length(&(this->tc_obuf).super_BufferBase);
    if (iVar1 == 0) break;
    iVar1 = OutputBuffer::write2fd(&this->tc_obuf,this->tc_fd);
    if (iVar1 == -1) {
      if (-1 < pr_level) {
        printf("[%-5s][%s:%d] write2fd error, close conn!\n","error","do_write",0x53);
      }
      do_close(this);
      return;
    }
  } while (iVar1 != 0);
  iVar1 = BufferBase::length(&(this->tc_obuf).super_BufferBase);
  if (iVar1 == 0) {
    EventLoop::del_from_poller(this->tc_loop,this->tc_fd,4);
  }
  return;
}

Assistant:

void TcpConnection::do_write() {
    while (tc_obuf.length()) {
        int ret;
        if (ret = tc_obuf.write2fd(tc_fd); ret == -1) {
            PR_ERROR("write2fd error, close conn!\n");
            this->do_close();
            return ;
        }
        if (ret == 0) {
            break;
        }
    }

    if (tc_obuf.length() == 0) {
        tc_loop->del_from_poller(tc_fd, EPOLLOUT);
    }

    return;    
}